

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void rethook(lua_State *L,CallInfo *ci,int nres)

{
  StkId pSVar1;
  long lVar2;
  CallInfo *pCVar3;
  Proto *p;
  int ftransfer;
  int delta;
  StkId firstres;
  int nres_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  if ((L->hookmask & 2U) != 0) {
    pSVar1 = (L->top).p;
    p._4_4_ = 0;
    if (((ci->callstatus & 2) == 0) &&
       (lVar2 = *(long *)((((ci->func).p)->val).value_.f + 0x18), *(char *)(lVar2 + 0xb) != '\0')) {
      p._4_4_ = (ci->u).l.nextraargs + (uint)*(byte *)(lVar2 + 10) + 1;
    }
    (ci->func).p = (ci->func).p + p._4_4_;
    luaD_hook(L,1,-1,(uint)((long)pSVar1 + ((long)nres * -0x10 - (ci->func).offset) >> 4) & 0xffff,
              nres);
    (ci->func).p = (ci->func).p + -(long)p._4_4_;
  }
  pCVar3 = ci->previous;
  if ((pCVar3->callstatus & 2) == 0) {
    L->oldpc = (int)((long)(pCVar3->u).l.savedpc -
                     *(long *)(*(long *)((((pCVar3->func).p)->val).value_.f + 0x18) + 0x40) >> 2) +
               -1;
  }
  return;
}

Assistant:

static void rethook (lua_State *L, CallInfo *ci, int nres) {
  if (L->hookmask & LUA_MASKRET) {  /* is return hook on? */
    StkId firstres = L->top.p - nres;  /* index of first result */
    int delta = 0;  /* correction for vararg functions */
    int ftransfer;
    if (isLua(ci)) {
      Proto *p = ci_func(ci)->p;
      if (p->is_vararg)
        delta = ci->u.l.nextraargs + p->numparams + 1;
    }
    ci->func.p += delta;  /* if vararg, back to virtual 'func' */
    ftransfer = cast(unsigned short, firstres - ci->func.p);
    luaD_hook(L, LUA_HOOKRET, -1, ftransfer, nres);  /* call it */
    ci->func.p -= delta;
  }
  if (isLua(ci = ci->previous))
    L->oldpc = pcRel(ci->u.l.savedpc, ci_func(ci)->p);  /* set 'oldpc' */
}